

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Mesh * __thiscall ON_Mesh::operator=(ON_Mesh *this,ON_Mesh *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ON_MeshNgon *ngon_00;
  ON_MeshParameters *__src;
  ON_MeshCurvatureStats *pOVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  float afVar11 [2];
  char cVar12;
  char cVar13;
  char cVar14;
  uint *puVar15;
  ON_MeshParameters *__dest;
  ON_MeshCurvatureStats *this_00;
  long lVar16;
  int iVar17;
  uint i;
  ulong uVar18;
  ON_MeshNgon *ngon;
  
  if (this != src) {
    Destroy(this);
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    ON_3fPointArray::operator=(&this->m_V,&src->m_V);
    ON_3dPointArray::operator=(&this->m_dV,&src->m_dV);
    ON_SimpleArray<ON_MeshFace>::operator=(&this->m_F,&src->m_F);
    ON_3fVectorArray::operator=(&this->m_N,&src->m_N);
    ON_3fVectorArray::operator=(&this->m_FN,&src->m_FN);
    ON_2fPointArray::operator=(&this->m_T,&src->m_T);
    ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&src->m_TC);
    ON_2dPointArray::operator=(&this->m_S,&src->m_S);
    ON_SimpleArray<bool>::operator=(&this->m_H,&src->m_H);
    this->m_hidden_count = src->m_hidden_count;
    uVar1 = (src->m_F).m_count;
    uVar2 = (src->m_Ngon).m_count;
    if (uVar2 != 0 && 0 < (int)uVar1) {
      uVar3 = (src->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      ON_SimpleArray<ON_MeshNgon_*>::Reserve(&this->m_Ngon,(ulong)uVar2);
      for (uVar18 = 0; uVar2 != uVar18; uVar18 = uVar18 + 1) {
        ngon_00 = (src->m_Ngon).m_a[uVar18];
        if (((ngon_00 != (ON_MeshNgon *)0x0) && (ngon_00->m_Vcount != 0)) &&
           (ngon_00->m_vi != (uint *)0x0)) {
          if (uVar3 < ngon_00->m_Vcount) {
            iVar17 = 0x220;
          }
          else if (uVar1 < ngon_00->m_Fcount) {
            iVar17 = 0x225;
          }
          else {
            if ((ngon_00->m_Fcount == 0) || (ngon_00->m_fi != (uint *)0x0)) {
              ngon = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,ngon_00);
              if (ngon != (ON_MeshNgon *)0x0) {
                ON_SimpleArray<ON_MeshNgon_*>::Append(&this->m_Ngon,&ngon);
              }
              goto LAB_0050e74b;
            }
            iVar17 = 0x22a;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,iVar17,"","Corrupt ngon");
        }
LAB_0050e74b:
      }
      puVar15 = NgonMap(src);
      if (puVar15 != (uint *)0x0) {
        CreateNgonMap(this);
      }
    }
    memcpy(&this->m_Ctag,&src->m_Ctag,0x98);
    memcpy(&this->m_Ttag,&src->m_Ttag,0x98);
    uVar5 = *(undefined8 *)&src->field_0x278;
    *(undefined8 *)&this->field_0x270 = *(undefined8 *)&src->field_0x270;
    *(undefined8 *)&this->field_0x278 = uVar5;
    uVar5 = *(undefined8 *)&src->field_0x288;
    *(undefined8 *)&this->field_0x280 = *(undefined8 *)&src->field_0x280;
    *(undefined8 *)&this->field_0x288 = uVar5;
    uVar5 = *(undefined8 *)&src->field_0x248;
    *(undefined8 *)&this->field_0x240 = *(undefined8 *)&src->field_0x240;
    *(undefined8 *)&this->field_0x248 = uVar5;
    uVar5 = *(undefined8 *)&src->field_0x258;
    *(undefined8 *)&this->field_0x250 = *(undefined8 *)&src->field_0x250;
    *(undefined8 *)&this->field_0x258 = uVar5;
    this->m_srf_scale[0] = src->m_srf_scale[0];
    this->m_srf_scale[1] = src->m_srf_scale[1];
    this->m_packed_tex_rotate = src->m_packed_tex_rotate;
    ON_SimpleArray<ON_SurfaceCurvature>::operator=(&this->m_K,&src->m_K);
    ON_SimpleArray<ON_Color>::operator=(&this->m_C,&src->m_C);
    this->m_parent = src->m_parent;
    if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      operator_delete(this->m_mesh_parameters,0xe0);
      this->m_mesh_parameters = (ON_MeshParameters *)0x0;
    }
    __src = src->m_mesh_parameters;
    if (__src != (ON_MeshParameters *)0x0) {
      __dest = (ON_MeshParameters *)operator_new(0xe0);
      memcpy(__dest,__src,0xe0);
      this->m_mesh_parameters = __dest;
    }
    iVar17 = src->m_quad_count;
    this->m_invalid_count = src->m_invalid_count;
    this->m_quad_count = iVar17;
    this->m_triangle_count = src->m_triangle_count;
    cVar12 = src->m_mesh_is_manifold;
    cVar13 = src->m_mesh_is_oriented;
    cVar14 = src->m_mesh_is_solid;
    this->m_mesh_is_closed = src->m_mesh_is_closed;
    this->m_mesh_is_manifold = cVar12;
    this->m_mesh_is_oriented = cVar13;
    this->m_mesh_is_solid = cVar14;
    dVar6 = (src->m_vertex_bbox).m_min.y;
    dVar7 = (src->m_vertex_bbox).m_min.z;
    dVar8 = (src->m_vertex_bbox).m_max.x;
    dVar9 = (src->m_vertex_bbox).m_max.y;
    dVar10 = (src->m_vertex_bbox).m_max.z;
    (this->m_vertex_bbox).m_min.x = (src->m_vertex_bbox).m_min.x;
    (this->m_vertex_bbox).m_min.y = dVar6;
    (this->m_vertex_bbox).m_min.z = dVar7;
    (this->m_vertex_bbox).m_max.x = dVar8;
    (this->m_vertex_bbox).m_max.y = dVar9;
    (this->m_vertex_bbox).m_max.z = dVar10;
    memcpy(&this->m_tight_bbox_cache,&src->m_tight_bbox_cache,0x248);
    uVar5 = *(undefined8 *)(src->m_nbox[0] + 2);
    *(undefined8 *)this->m_nbox[0] = *(undefined8 *)src->m_nbox[0];
    *(undefined8 *)(this->m_nbox[0] + 2) = uVar5;
    *(undefined8 *)(this->m_nbox[1] + 1) = *(undefined8 *)(src->m_nbox[1] + 1);
    afVar11 = src->m_tbox[1];
    this->m_tbox[0] = src->m_tbox[0];
    this->m_tbox[1] = afVar11;
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      pOVar4 = this->m_kstat[lVar16];
      if (pOVar4 != (ON_MeshCurvatureStats *)0x0) {
        ON_MeshCurvatureStats::~ON_MeshCurvatureStats(pOVar4);
        operator_delete(pOVar4,0x40);
        this->m_kstat[lVar16] = (ON_MeshCurvatureStats *)0x0;
      }
      pOVar4 = src->m_kstat[lVar16];
      if (pOVar4 != (ON_MeshCurvatureStats *)0x0) {
        this_00 = (ON_MeshCurvatureStats *)operator_new(0x40);
        ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_00,pOVar4);
        this->m_kstat[lVar16] = this_00;
      }
    }
  }
  return this;
}

Assistant:

ON_Mesh& ON_Mesh::operator=( const ON_Mesh& src )
{
  if ( this != &src ) 
  {
    Destroy();
    ON_Geometry::operator=(src);

    m_V  = src.m_V;
    m_dV = src.m_dV;
    m_F  = src.m_F;
    m_N  = src.m_N;
    m_FN = src.m_FN;
    m_T  = src.m_T;
    m_TC = src.m_TC;
    m_S  = src.m_S;
    m_H  = src.m_H;
    m_hidden_count = src.m_hidden_count;


    unsigned int ngon_count = src.HasNgons() ? src.m_Ngon.UnsignedCount() : 0;
    if ( ngon_count > 0 )
    {
      const unsigned int src_V_count = src.m_V.UnsignedCount();
      const unsigned int src_F_count = src.m_F.UnsignedCount();
      m_Ngon.Reserve(ngon_count);
      for ( unsigned int i = 0; i < ngon_count; i++ )
      {
        const ON_MeshNgon* src_ngon = src.m_Ngon[i];
        if ( 0 == src_ngon )
          continue;
        if ( src_ngon->m_Vcount <= 0 )
          continue;
        if ( 0 == src_ngon->m_vi )
          continue;
        if ( src_ngon->m_Vcount > src_V_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( src_ngon->m_Fcount > src_F_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( 0 == src_ngon->m_fi && src_ngon->m_Fcount > 0 )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        ON_MeshNgon* ngon = m_NgonAllocator.CopyNgon(src_ngon);
        if (ngon)
          m_Ngon.Append(ngon);
      }
      if ( 0 != src.NgonMap())
      {
        this->CreateNgonMap();
      }
    }

    m_Ctag = src.m_Ctag;
    m_Ttag = src.m_Ttag;
    m_packed_tex_domain[0] = src.m_packed_tex_domain[0];
    m_packed_tex_domain[1] = src.m_packed_tex_domain[1];
    m_srf_domain[0] = src.m_srf_domain[0];
    m_srf_domain[1] = src.m_srf_domain[1];
    m_srf_scale[0] = src.m_srf_scale[0];
    m_srf_scale[1] = src.m_srf_scale[1];
    m_packed_tex_rotate = src.m_packed_tex_rotate;

    m_K = src.m_K;
    m_C = src.m_C;

    m_parent         = src.m_parent;
    //m_material_index = src.m_material_index;

    if ( m_mesh_parameters ) {
      delete m_mesh_parameters;
      m_mesh_parameters = 0;
    }
    if ( src.m_mesh_parameters )
      m_mesh_parameters = new ON_MeshParameters(*src.m_mesh_parameters);

    m_invalid_count = src.m_invalid_count;
    m_quad_count = src.m_quad_count;
    m_triangle_count = src.m_triangle_count;

    m_mesh_is_closed = src.m_mesh_is_closed;
    m_mesh_is_manifold = src.m_mesh_is_manifold;
    m_mesh_is_oriented = src.m_mesh_is_oriented;
    m_mesh_is_solid    = src.m_mesh_is_solid;

    m_vertex_bbox = src.m_vertex_bbox;
    m_tight_bbox_cache = src.m_tight_bbox_cache;
    memcpy(m_nbox,src.m_nbox,sizeof(m_nbox));
    memcpy(m_tbox,src.m_tbox,sizeof(m_tbox));

    int i;
    for ( i = 0; i < 4; i++ ) {
      if ( m_kstat[i] ) 
      {
        delete m_kstat[i];
        m_kstat[i] = 0;
      }
      if ( src.m_kstat[i] )
      {
        m_kstat[i] = new ON_MeshCurvatureStats(*src.m_kstat[i]);
      }
    }

    // do not copy m_top

    // Do not copy m_mesh_cache. Cached information will
    // be recalculated if it is needed.
  }
  return *this;
}